

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateManualResize
               (ImGuiWindow *window,ImVec2 *size_auto_fit,int *border_held,int resize_grip_count,
               ImU32 *resize_grip_col)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImGuiID IVar4;
  ImU32 IVar5;
  ImGuiMouseCursor IVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  ImGuiCol local_164;
  float NAV_RESIZE_SPEED;
  ImVec2 local_128;
  ImVec2 nav_resize_delta;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 border_posn;
  ImVec2 border_target;
  ImRect border_rect;
  bool held_1;
  bool hovered_1;
  float BORDER_APPEAR_TIMER;
  float BORDER_SIZE;
  int border_n;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 corner_target;
  bool local_9a;
  bool local_99;
  bool held;
  ImVec2 IStack_98;
  bool hovered;
  ImVec2 local_90;
  undefined1 local_88 [8];
  ImRect resize_rect;
  ImVec2 local_70;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  float fStack_58;
  int resize_grip_n;
  ImVec2 size_target;
  ImVec2 pos_target;
  float grip_hover_size;
  float grip_draw_size;
  int resize_border_count;
  ImGuiWindowFlags flags;
  ImGuiContext *g;
  ImU32 *resize_grip_col_local;
  int resize_grip_count_local;
  int *border_held_local;
  ImVec2 *size_auto_fit_local;
  ImGuiWindow *window_local;
  
  pIVar2 = GImGui;
  uVar1 = window->Flags;
  if ((uVar1 & 2) != 0) {
    return;
  }
  if ((uVar1 & 0x40) != 0) {
    return;
  }
  if (0 < window->AutoFitFramesX) {
    return;
  }
  if (0 < window->AutoFitFramesY) {
    return;
  }
  iVar3 = 0;
  if ((uVar1 & 0x20000) != 0) {
    iVar3 = 4;
  }
  fVar7 = ImMax<float>(GImGui->FontSize * 1.35,GImGui->FontSize * 0.2 + window->WindowRounding + 1.0
                      );
  ImVec2::ImVec2(&size_target,3.4028235e+38,3.4028235e+38);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8,3.4028235e+38,3.4028235e+38);
  PushID("#RESIZE");
  for (grip._4_4_ = 0; (int)grip._4_4_ < resize_grip_count; grip._4_4_ = grip._4_4_ + 1) {
    corner = (ImVec2)(resize_grip_def + (int)grip._4_4_);
    resize_rect.Max = ::operator+(&window->Pos,&window->Size);
    local_70 = ImLerp(&window->Pos,&resize_rect.Max,(ImVec2 *)corner);
    IStack_98 = ::operator*((ImVec2 *)((long)corner + 8),(float)(int)((float)(int)fVar7 * 0.75));
    local_90 = ::operator+(&local_70,&stack0xffffffffffffff68);
    ImRect::ImRect((ImRect *)local_88,&local_70,&local_90);
    if (resize_rect.Min.x < (float)local_88._0_4_) {
      ImSwap<float>((float *)local_88,(float *)&resize_rect);
    }
    if (resize_rect.Min.y < (float)local_88._4_4_) {
      ImSwap<float>((float *)(local_88 + 4),&resize_rect.Min.y);
    }
    IVar4 = ImGuiWindow::GetID(window,(void *)(long)(int)grip._4_4_);
    ButtonBehavior((ImRect *)local_88,IVar4,&local_99,&local_9a,0x2020);
    if (((local_99 & 1U) != 0) || ((local_9a & 1U) != 0)) {
      IVar6 = 6;
      if ((grip._4_4_ & 1) != 0) {
        IVar6 = 5;
      }
      pIVar2->MouseCursor = IVar6;
    }
    if ((((pIVar2->HoveredWindow == window) && ((local_9a & 1U) != 0)) &&
        (((pIVar2->IO).MouseDoubleClicked[0] & 1U) != 0)) && (grip._4_4_ == 0)) {
      corner_target = *size_auto_fit;
      _fStack_58 = CalcSizeAfterConstraint(window,corner_target);
      ClearActiveID();
    }
    else if ((local_9a & 1U) != 0) {
      local_c0 = ::operator-(&(pIVar2->IO).MousePos,&pIVar2->ActiveIdClickOffset);
      _BORDER_SIZE = ImRect::GetSize((ImRect *)local_88);
      local_c8 = ::operator*((ImVec2 *)&BORDER_SIZE,(ImVec2 *)corner);
      local_b8 = ::operator+(&local_c0,&local_c8);
      CalcResizePosSizeFromAnyCorner
                (window,&local_b8,(ImVec2 *)corner,&size_target,(ImVec2 *)&stack0xffffffffffffffa8);
    }
    if (((grip._4_4_ == 0) || ((local_9a & 1U) != 0)) || ((local_99 & 1U) != 0)) {
      if ((local_9a & 1U) == 0) {
        local_164 = 0x1e;
        if ((local_99 & 1U) != 0) {
          local_164 = 0x1f;
        }
      }
      else {
        local_164 = 0x20;
      }
      IVar5 = GetColorU32(local_164,1.0);
      resize_grip_col[(int)grip._4_4_] = IVar5;
    }
  }
  for (BORDER_APPEAR_TIMER = 0.0; (int)BORDER_APPEAR_TIMER < iVar3;
      BORDER_APPEAR_TIMER = (float)((int)BORDER_APPEAR_TIMER + 1)) {
    border_rect.Max.y = 0.05;
    _border_target =
         GetBorderRect(window,(int)BORDER_APPEAR_TIMER,(float)(int)((float)(int)fVar7 * 0.75),5.0);
    IVar4 = ImGuiWindow::GetID(window,(void *)(long)((int)BORDER_APPEAR_TIMER + 4));
    ButtonBehavior((ImRect *)&border_target,IVar4,(bool *)((long)&border_rect.Max.x + 3),
                   (bool *)((long)&border_rect.Max.x + 2),0x20);
    if ((((border_rect.Max.x._3_1_ & 1) != 0) && (0.05 < pIVar2->HoveredIdTimer)) ||
       ((border_rect.Max.x._2_1_ & 1) != 0)) {
      IVar6 = 3;
      if (((uint)BORDER_APPEAR_TIMER & 1) != 0) {
        IVar6 = 4;
      }
      pIVar2->MouseCursor = IVar6;
      if ((border_rect.Max.x._2_1_ & 1) != 0) {
        *border_held = (int)BORDER_APPEAR_TIMER;
      }
    }
    if ((border_rect.Max.x._2_1_ & 1) != 0) {
      border_posn = window->Pos;
      ImVec2::ImVec2(&local_100);
      if (BORDER_APPEAR_TIMER == 0.0) {
        ImVec2::ImVec2(&local_108,0.0,0.0);
        local_100 = local_108;
        border_posn.y = (pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y;
      }
      if (BORDER_APPEAR_TIMER == 1.4013e-45) {
        ImVec2::ImVec2(&local_110,1.0,0.0);
        local_100 = local_110;
        border_posn.x = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) + 5.0;
      }
      if (BORDER_APPEAR_TIMER == 2.8026e-45) {
        ImVec2::ImVec2(&local_118,0.0,1.0);
        local_100 = local_118;
        border_posn.y = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) + 5.0;
      }
      if (BORDER_APPEAR_TIMER == 4.2039e-45) {
        ImVec2::ImVec2(&nav_resize_delta,0.0,0.0);
        local_100 = nav_resize_delta;
        border_posn.x = (pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x;
      }
      CalcResizePosSizeFromAnyCorner
                (window,&border_posn,&local_100,&size_target,(ImVec2 *)&stack0xffffffffffffffa8);
    }
  }
  PopID();
  if (pIVar2->NavWindowingTarget == window) {
    ImVec2::ImVec2(&local_128);
    if ((pIVar2->NavInputSource == ImGuiInputSource_NavKeyboard) &&
       (((pIVar2->IO).KeyShift & 1U) != 0)) {
      local_128 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
    }
    if (pIVar2->NavInputSource == ImGuiInputSource_NavGamepad) {
      local_128 = GetNavInputAmount2d(2,ImGuiInputReadMode_Down,0.0,0.0);
    }
    if ((local_128.x == 0.0) && (!NAN(local_128.x))) {
      if ((local_128.y == 0.0) && (!NAN(local_128.y))) goto LAB_001d346a;
    }
    fVar7 = (pIVar2->IO).DeltaTime;
    fVar8 = ImMin<float>((pIVar2->IO).DisplayFramebufferScale.x,
                         (pIVar2->IO).DisplayFramebufferScale.y);
    fVar7 = ImFloor(fVar7 * 600.0 * fVar8);
    operator*=(&local_128,fVar7);
    pIVar2->NavWindowingToggleLayer = false;
    pIVar2->NavDisableMouseHover = true;
    IVar5 = GetColorU32(0x20,1.0);
    *resize_grip_col = IVar5;
    IVar9 = ::operator+(&window->SizeFull,&local_128);
    _fStack_58 = CalcSizeAfterConstraint(window,IVar9);
  }
LAB_001d346a:
  if ((fStack_58 != 3.4028235e+38) || (NAN(fStack_58))) {
    window->SizeFull = _fStack_58;
    MarkIniSettingsDirty(window);
  }
  if ((size_target.x != 3.4028235e+38) || (NAN(size_target.x))) {
    IVar9 = ImFloor(&size_target);
    window->Pos = IVar9;
    MarkIniSettingsDirty(window);
  }
  window->Size = window->SizeFull;
  return;
}

Assistant:

static void ImGui::UpdateManualResize(ImGuiWindow* window, const ImVec2& size_auto_fit, int* border_held, int resize_grip_count, ImU32 resize_grip_col[4])
{
    ImGuiContext& g = *GImGui;
    ImGuiWindowFlags flags = window->Flags;
    if ((flags & ImGuiWindowFlags_NoResize) || (flags & ImGuiWindowFlags_AlwaysAutoResize) || window->AutoFitFramesX > 0 || window->AutoFitFramesY > 0)
        return;

    const int resize_border_count = (flags & ImGuiWindowFlags_ResizeFromAnySide) ? 4 : 0;
    const float grip_draw_size = (float)(int)ImMax(g.FontSize * 1.35f, window->WindowRounding + 1.0f + g.FontSize * 0.2f);
    const float grip_hover_size = (float)(int)(grip_draw_size * 0.75f);

    ImVec2 pos_target(FLT_MAX, FLT_MAX);
    ImVec2 size_target(FLT_MAX, FLT_MAX);

    // Manual resize grips
    PushID("#RESIZE");
    for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
    {
        const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
        const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPos);

        // Using the FlattenChilds button flag we make the resize button accessible even if we are hovering over a child window
        ImRect resize_rect(corner, corner + grip.InnerDir * grip_hover_size);
        if (resize_rect.Min.x > resize_rect.Max.x) ImSwap(resize_rect.Min.x, resize_rect.Max.x);
        if (resize_rect.Min.y > resize_rect.Max.y) ImSwap(resize_rect.Min.y, resize_rect.Max.y);
        bool hovered, held;
        ButtonBehavior(resize_rect, window->GetID((void*)(intptr_t)resize_grip_n), &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_NoNavFocus);
        if (hovered || held)
            g.MouseCursor = (resize_grip_n & 1) ? ImGuiMouseCursor_ResizeNESW : ImGuiMouseCursor_ResizeNWSE;

        if (g.HoveredWindow == window && held && g.IO.MouseDoubleClicked[0] && resize_grip_n == 0)
        {
            // Manual auto-fit when double-clicking
            size_target = CalcSizeAfterConstraint(window, size_auto_fit);
            ClearActiveID();
        }
        else if (held)
        {
            // Resize from any of the four corners
            // We don't use an incremental MouseDelta but rather compute an absolute target size based on mouse position
            ImVec2 corner_target = g.IO.MousePos - g.ActiveIdClickOffset + resize_rect.GetSize() * grip.CornerPos; // Corner of the window corresponding to our corner grip
            CalcResizePosSizeFromAnyCorner(window, corner_target, grip.CornerPos, &pos_target, &size_target);
        }
        if (resize_grip_n == 0 || held || hovered)
            resize_grip_col[resize_grip_n] = GetColorU32(held ? ImGuiCol_ResizeGripActive : hovered ? ImGuiCol_ResizeGripHovered : ImGuiCol_ResizeGrip);
    }
    for (int border_n = 0; border_n < resize_border_count; border_n++)
    {
        const float BORDER_SIZE = 5.0f;          // FIXME: Only works _inside_ window because of HoveredWindow check.
        const float BORDER_APPEAR_TIMER = 0.05f; // Reduce visual noise
        bool hovered, held;
        ImRect border_rect = GetBorderRect(window, border_n, grip_hover_size, BORDER_SIZE);
        ButtonBehavior(border_rect, window->GetID((void*)(intptr_t)(border_n + 4)), &hovered, &held, ImGuiButtonFlags_FlattenChildren);
        if ((hovered && g.HoveredIdTimer > BORDER_APPEAR_TIMER) || held)
        {
            g.MouseCursor = (border_n & 1) ? ImGuiMouseCursor_ResizeEW : ImGuiMouseCursor_ResizeNS;
            if (held) *border_held = border_n;
        }
        if (held)
        {
            ImVec2 border_target = window->Pos;
            ImVec2 border_posn;
            if (border_n == 0) { border_posn = ImVec2(0, 0); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y); }
            if (border_n == 1) { border_posn = ImVec2(1, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + BORDER_SIZE); }
            if (border_n == 2) { border_posn = ImVec2(0, 1); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + BORDER_SIZE); }
            if (border_n == 3) { border_posn = ImVec2(0, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x); }
            CalcResizePosSizeFromAnyCorner(window, border_target, border_posn, &pos_target, &size_target);
        }
    }
    PopID();

    // Navigation resize (keyboard/gamepad)
    if (g.NavWindowingTarget == window)
    {
        ImVec2 nav_resize_delta;
        if (g.NavInputSource == ImGuiInputSource_NavKeyboard && g.IO.KeyShift)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_NavGamepad)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_Down);
        if (nav_resize_delta.x != 0.0f || nav_resize_delta.y != 0.0f)
        {
            const float NAV_RESIZE_SPEED = 600.0f;
            nav_resize_delta *= ImFloor(NAV_RESIZE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y));
            g.NavWindowingToggleLayer = false;
            g.NavDisableMouseHover = true;
            resize_grip_col[0] = GetColorU32(ImGuiCol_ResizeGripActive);
            // FIXME-NAV: Should store and accumulate into a separate size buffer to handle sizing constraints properly, right now a constraint will make us stuck.
            size_target = CalcSizeAfterConstraint(window, window->SizeFull + nav_resize_delta);
        }
    }

    // Apply back modified position/size to window
    if (size_target.x != FLT_MAX)
    {
        window->SizeFull = size_target;
        MarkIniSettingsDirty(window);
    }
    if (pos_target.x != FLT_MAX)
    {
        window->Pos = ImFloor(pos_target);
        MarkIniSettingsDirty(window);
    }

    window->Size = window->SizeFull;
}